

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# top_down_sah_builder.h
# Opt level: O3

Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> * __thiscall
bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::build
          (Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *__return_storage_ptr__,
          TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *this)

{
  undefined8 uVar1;
  iterator __position;
  pointer pBVar2;
  WorkItem *pWVar3;
  long lVar4;
  int iVar5;
  undefined4 extraout_var;
  ulong uVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar7;
  size_t sVar8;
  ulong extraout_RDX;
  ulong uVar9;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  pointer pNVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  WorkItem first_item;
  WorkItem second_item;
  stack<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>_>
  stack;
  undefined1 local_118 [8];
  float fStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  float fStack_104;
  WorkItem local_f8;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_e0;
  undefined1 local_d8 [48];
  _Elt_pointer pWStack_a8;
  _Elt_pointer pWStack_a0;
  _Elt_pointer pWStack_98;
  _Map_pointer ppWStack_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined4 extraout_var_00;
  
  sVar10 = (this->bboxes_)._M_extent._M_extent_value;
  (__return_storage_ptr__->nodes).
  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->prim_ids).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->prim_ids).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->prim_ids).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nodes).
  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nodes).
  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->nodes).
  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->prim_ids).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e0 = __return_storage_ptr__;
  std::
  vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
  ::reserve(&__return_storage_ptr__->nodes,(sVar10 * 2) / this->config_->min_leaf_size);
  __position._M_current =
       (__return_storage_ptr__->nodes).
       super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (__return_storage_ptr__->nodes).
      super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
    ::_M_realloc_insert<>(&__return_storage_ptr__->nodes,__position);
    pNVar14 = (__return_storage_ptr__->nodes).
              super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    ((__position._M_current)->bounds)._M_elems[3] = 0.0;
    ((__position._M_current)->bounds)._M_elems[4] = 0.0;
    *(undefined8 *)(((__position._M_current)->bounds)._M_elems + 5) = 0;
    ((__position._M_current)->bounds)._M_elems[0] = 0.0;
    ((__position._M_current)->bounds)._M_elems[1] = 0.0;
    ((__position._M_current)->bounds)._M_elems[2] = 0.0;
    ((__position._M_current)->bounds)._M_elems[3] = 0.0;
    pNVar14 = (__return_storage_ptr__->nodes).
              super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
              ._M_impl.super__Vector_impl_data._M_finish + 1;
    (__return_storage_ptr__->nodes).
    super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar14;
  }
  iVar5 = (**this->_vptr_TopDownSahBuilder)();
  auVar18 = ZEXT816(0x7f7fffff7f7fffff);
  local_118 = (undefined1  [8])0xff7fffffff7fffff;
  fStack_110 = -3.4028235e+38;
  auVar17 = ZEXT464(0x7f7fffff);
  auVar19 = ZEXT416(0x7f7fffff);
  auVar16 = ZEXT816(0xff7fffffff7fffff);
  auVar20 = ZEXT464(0xff7fffff);
  if (sVar10 != 0) {
    sVar8 = 0;
    pBVar2 = (this->bboxes_)._M_ptr;
    do {
      lVar11 = *(long *)(*(long *)CONCAT44(extraout_var,iVar5) + sVar8 * 8);
      sVar8 = sVar8 + 1;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = *(ulong *)pBVar2[lVar11].min.values;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = *(ulong *)pBVar2[lVar11].max.values;
      auVar19 = vminss_avx(auVar17._0_16_,ZEXT416((uint)pBVar2[lVar11].min.values[2]));
      auVar17 = ZEXT1664(auVar19);
      auVar28 = vmaxss_avx(auVar20._0_16_,ZEXT416((uint)pBVar2[lVar11].max.values[2]));
      auVar20 = ZEXT1664(auVar28);
      auVar18 = vminps_avx(auVar18,auVar22);
      auVar16 = vmaxps_avx(auVar16,auVar25);
    } while (sVar10 != sVar8);
  }
  auVar16 = vunpcklps_avx(auVar18,auVar16);
  *(undefined1 (*) [16])pNVar14[-1].bounds._M_elems = auVar16;
  pNVar14[-1].bounds._M_elems[4] = auVar19._0_4_;
  pNVar14[-1].bounds._M_elems[5] = auVar20._0_4_;
  pWStack_98 = (_Elt_pointer)0x0;
  ppWStack_90 = (_Map_pointer)0x0;
  local_d8._0_4_ = 0;
  local_d8._4_4_ = 0;
  local_d8._8_4_ = 0;
  local_d8._12_4_ = 0;
  local_d8._16_8_ = (_Elt_pointer)0x0;
  local_d8._24_24_ = (undefined1  [24])0x0;
  pWStack_a8 = (_Elt_pointer)0x0;
  pWStack_a0 = (_Elt_pointer)0x0;
  std::
  _Deque_base<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>
  ::_M_initialize_map((_Deque_base<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>
                       *)local_d8,0);
  local_118 = (undefined1  [8])0x0;
  fStack_110 = 0.0;
  uStack_10c = 0;
  uStack_108 = (undefined4)sVar10;
  fStack_104 = (float)(sVar10 >> 0x20);
  std::
  deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem,std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem>>
  ::emplace_back<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem>
            ((deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem,std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem>>
              *)local_d8,(WorkItem *)local_118);
  if (pWStack_a8 != (_Elt_pointer)local_d8._16_8_) {
    do {
      if (pWStack_a8 == pWStack_a0) {
        pWVar3 = ppWStack_90[-1];
        sVar10 = pWVar3[0x14].node_id;
        uVar12 = pWVar3[0x14].begin;
        uVar15 = pWVar3[0x14].end;
        operator_delete(pWStack_a0,0x1f8);
        pWStack_a0 = ppWStack_90[-1];
        pWStack_98 = pWStack_a0 + 0x15;
        pWStack_a8 = pWStack_a0 + 0x14;
        ppWStack_90 = ppWStack_90 + -1;
      }
      else {
        sVar10 = pWStack_a8[-1].node_id;
        uVar12 = pWStack_a8[-1].begin;
        uVar15 = pWStack_a8[-1].end;
        pWStack_a8 = pWStack_a8 + -1;
      }
      pNVar14 = (__return_storage_ptr__->nodes).
                super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start + sVar10;
      if (this->config_->min_leaf_size < uVar15 - uVar12) {
        fStack_110 = (pNVar14->bounds)._M_elems[4];
        fStack_104 = (pNVar14->bounds)._M_elems[5];
        auVar16 = vinsertps_avx(ZEXT416((uint)(pNVar14->bounds)._M_elems[0]),
                                ZEXT416((uint)(pNVar14->bounds)._M_elems[2]),0x10);
        auVar18 = vinsertps_avx(ZEXT416((uint)(pNVar14->bounds)._M_elems[1]),
                                ZEXT416((uint)(pNVar14->bounds)._M_elems[3]),0x10);
        local_118 = (undefined1  [8])vmovlps_avx(auVar16);
        uVar1 = vmovlps_avx(auVar18);
        uStack_10c = (undefined4)uVar1;
        uStack_108 = (undefined4)((ulong)uVar1 >> 0x20);
        iVar5 = (*this->_vptr_TopDownSahBuilder[1])(this,local_118,uVar12,uVar15);
        uVar6 = CONCAT44(extraout_var_00,iVar5);
        __return_storage_ptr__ = local_e0;
        if ((extraout_RDX & 1) == 0) goto LAB_00103d94;
        lVar11 = (long)(local_e0->nodes).
                       super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_e0->nodes).
                       super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar13 = (lVar11 >> 2) * 0x6db6db6db6db6db7;
        if (0xfffffff < uVar13) {
          __assert_fail("first_id <= static_cast<size_t>(max_first_id)",
                        "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/index.h"
                        ,0x4f,
                        "bvh::v2::Index<32, 4>::Index(size_t, size_t) [Bits = 32, PrimCountBits = 4]"
                       );
        }
        (pNVar14->index).value = (int)uVar13 << 4;
        std::
        vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
        ::resize(&local_e0->nodes,uVar13 + 2);
        iVar5 = (**this->_vptr_TopDownSahBuilder)();
        local_f8.begin._0_4_ = 0xff7fffff;
        local_f8.node_id = 0xff7fffffff7fffff;
        fStack_110 = 3.4028235e+38;
        local_118 = (undefined1  [8])0x7f7fffff7f7fffff;
        auVar21 = ZEXT864(0x7f7fffff7f7fffff);
        local_58 = ZEXT816(0x7f7fffff7f7fffff);
        auVar17 = ZEXT464(0x7f7fffff);
        local_78 = ZEXT416(0x7f7fffff);
        auVar24 = ZEXT864(0xff7fffffff7fffff);
        local_68 = ZEXT816(0xff7fffffff7fffff);
        auVar20 = ZEXT464(0xff7fffff);
        local_88 = ZEXT416(0xff7fffff);
        if (uVar12 < uVar6) {
          pBVar2 = (this->bboxes_)._M_ptr;
          uVar9 = uVar12;
          do {
            lVar4 = *(long *)(*(long *)CONCAT44(extraout_var_01,iVar5) + uVar9 * 8);
            uVar9 = uVar9 + 1;
            auVar16._8_8_ = 0;
            auVar16._0_8_ = *(ulong *)pBVar2[lVar4].min.values;
            auVar18._8_8_ = 0;
            auVar18._0_8_ = *(ulong *)pBVar2[lVar4].max.values;
            local_78 = vminss_avx(auVar17._0_16_,ZEXT416((uint)pBVar2[lVar4].min.values[2]));
            auVar17 = ZEXT1664(local_78);
            local_88 = vmaxss_avx(auVar20._0_16_,ZEXT416((uint)pBVar2[lVar4].max.values[2]));
            auVar20 = ZEXT1664(local_88);
            local_58 = vminps_avx(auVar21._0_16_,auVar16);
            auVar21 = ZEXT1664(local_58);
            local_68 = vmaxps_avx(auVar24._0_16_,auVar18);
            auVar24 = ZEXT1664(local_68);
          } while (uVar6 != uVar9);
        }
        iVar5 = (**this->_vptr_TopDownSahBuilder)();
        __return_storage_ptr__ = local_e0;
        auVar19 = ZEXT816(0x7f7fffff7f7fffff);
        auVar17 = ZEXT464(0x7f7fffff);
        auVar28 = ZEXT416(0x7f7fffff);
        auVar21 = ZEXT864(0xff7fffffff7fffff);
        auVar16 = ZEXT816(0xff7fffffff7fffff);
        auVar20 = ZEXT464(0xff7fffff);
        auVar18 = ZEXT416(0xff7fffff);
        if (uVar6 < uVar15) {
          pBVar2 = (this->bboxes_)._M_ptr;
          uVar9 = uVar6;
          do {
            lVar4 = *(long *)(*(long *)CONCAT44(extraout_var_02,iVar5) + uVar9 * 8);
            uVar9 = uVar9 + 1;
            auVar23._8_8_ = 0;
            auVar23._0_8_ = *(ulong *)pBVar2[lVar4].min.values;
            auVar26._8_8_ = 0;
            auVar26._0_8_ = *(ulong *)pBVar2[lVar4].max.values;
            auVar28 = vminss_avx(auVar17._0_16_,ZEXT416((uint)pBVar2[lVar4].min.values[2]));
            auVar17 = ZEXT1664(auVar28);
            auVar18 = vmaxss_avx(auVar20._0_16_,ZEXT416((uint)pBVar2[lVar4].max.values[2]));
            auVar20 = ZEXT1664(auVar18);
            auVar19 = vminps_avx(auVar19,auVar23);
            auVar16 = vmaxps_avx(auVar21._0_16_,auVar26);
            auVar21 = ZEXT1664(auVar16);
          } while (uVar15 != uVar9);
        }
        auVar22 = vinsertps_avx(local_88,auVar18,0x10);
        auVar25 = vinsertps_avx(local_78,auVar28,0x10);
        auVar25 = vsubps_avx(auVar22,auVar25);
        auVar23 = vsubps_avx(auVar16,auVar19);
        auVar26 = vunpcklps_avx(auVar19,auVar16);
        auVar16 = vsubps_avx(local_68,local_58);
        auVar19 = vinsertps_avx(auVar16,auVar23,0x1c);
        auVar22 = vinsertps_avx(auVar23,auVar16,0x4c);
        auVar16 = vhaddps_avx(auVar16,auVar23);
        auVar27._0_4_ = auVar22._0_4_ * auVar19._0_4_;
        auVar27._4_4_ = auVar22._4_4_ * auVar19._4_4_;
        auVar27._8_4_ = auVar22._8_4_ * auVar19._8_4_;
        auVar27._12_4_ = auVar22._12_4_ * auVar19._12_4_;
        auVar16 = vshufps_avx(auVar16,auVar16,0xe8);
        auVar22 = vfmadd213ps_fma(auVar16,auVar25,auVar27);
        auVar19 = vunpcklps_avx(local_58,local_68);
        auVar16 = vmovshdup_avx(auVar22);
        uVar9 = uVar6;
        uVar7 = uVar12;
        local_f8.begin = uVar6;
        auVar25 = auVar26;
        auVar23 = local_88;
        auVar27 = local_78;
        if (auVar22._0_4_ < auVar16._0_4_) {
          uVar9 = uVar15;
          uVar7 = uVar6;
          local_f8.begin = uVar12;
          uVar15 = uVar6;
          auVar25 = auVar19;
          auVar19 = auVar26;
          auVar23 = auVar18;
          auVar27 = auVar28;
          auVar28 = local_78;
          auVar18 = local_88;
        }
        uVar12 = uVar13 + 1;
        fStack_110 = (float)uVar7;
        uStack_10c = (undefined4)(uVar7 >> 0x20);
        uStack_108 = (undefined4)uVar9;
        fStack_104 = (float)(uVar9 >> 0x20);
        local_f8.node_id = uVar12;
        pNVar14 = (local_e0->nodes).
                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar4 = uVar13 + 1 + uVar12 * 0x1b;
        *(undefined1 (*) [16])((long)pNVar14 + lVar11) = auVar19;
        *(int *)((long)pNVar14 + lVar11 + 0x10) = auVar27._0_4_;
        *(int *)((long)pNVar14 + lVar11 + 0x14) = auVar23._0_4_;
        *(undefined1 (*) [16])((long)pNVar14 + lVar4) = auVar25;
        *(int *)((long)pNVar14 + lVar4 + 0x10) = auVar28._0_4_;
        *(int *)((long)pNVar14 + lVar4 + 0x14) = auVar18._0_4_;
        local_118 = (undefined1  [8])uVar13;
        local_f8.end = uVar15;
        if (uVar9 - uVar7 < uVar15 - local_f8.begin) {
          fStack_110 = (float)local_f8.begin;
          uStack_10c = (undefined4)(local_f8.begin >> 0x20);
          uStack_108 = (undefined4)uVar15;
          fStack_104 = (float)(uVar15 >> 0x20);
          local_f8.begin = uVar7;
          local_f8.node_id = uVar13;
          local_118 = (undefined1  [8])uVar12;
          local_f8.end = uVar9;
        }
        if (pWStack_a8 == pWStack_98 + -1) {
          std::
          deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem,std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem>>
          ::
          _M_push_back_aux<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem_const&>
                    ((deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem,std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem>>
                      *)local_d8,(WorkItem *)local_118);
        }
        else {
          pWStack_a8->end = CONCAT44(fStack_104,uStack_108);
          pWStack_a8->node_id = (size_t)local_118;
          pWStack_a8->begin = CONCAT44(uStack_10c,fStack_110);
          pWStack_a8 = pWStack_a8 + 1;
        }
        if (pWStack_a8 == pWStack_98 + -1) {
          std::
          deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem,std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem>>
          ::
          _M_push_back_aux<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem_const&>
                    ((deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem,std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem>>
                      *)local_d8,&local_f8);
        }
        else {
          pWStack_a8->end = local_f8.end;
          pWStack_a8->node_id = local_f8.node_id;
          pWStack_a8->begin = local_f8.begin;
          pWStack_a8 = pWStack_a8 + 1;
        }
      }
      else {
        if (uVar15 == uVar12) {
          __assert_fail("prim_count != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/index.h"
                        ,0x41,
                        "static Index<Bits, PrimCountBits> bvh::v2::Index<32, 4>::make_leaf(size_t, size_t) [Bits = 32, PrimCountBits = 4]"
                       );
        }
LAB_00103d94:
        Index<32UL,_4UL>::Index((Index<32UL,_4UL> *)local_118,uVar12,uVar15 - uVar12);
        (pNVar14->index).value = local_118._0_4_;
      }
    } while (pWStack_a8 != (_Elt_pointer)local_d8._16_8_);
  }
  iVar5 = (**this->_vptr_TopDownSahBuilder)(this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&__return_storage_ptr__->prim_ids,iVar5);
  if ((__return_storage_ptr__->nodes).
      super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (__return_storage_ptr__->nodes).
      super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>,_true>
    ::_S_do_it(&__return_storage_ptr__->nodes);
  }
  std::
  _Deque_base<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>
  ::~_Deque_base((_Deque_base<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>
                  *)local_d8);
  return __return_storage_ptr__;
}

Assistant:

Bvh<Node> build() {
        const auto prim_count = bboxes_.size();

        Bvh<Node> bvh;
        bvh.nodes.reserve((2 * prim_count) / config_.min_leaf_size);
        bvh.nodes.emplace_back();
        bvh.nodes.back().set_bbox(compute_bbox(0, prim_count));

        std::stack<WorkItem> stack;
        stack.push(WorkItem { 0, 0, prim_count });
        while (!stack.empty()) {
            auto item = stack.top();
            stack.pop();

            auto& node = bvh.nodes[item.node_id];
            if (item.size() > config_.min_leaf_size) {
                if (auto split_pos = try_split(node.get_bbox(), item.begin, item.end)) {
                    auto first_child = bvh.nodes.size();
                    node.index = Node::Index::make_inner(first_child);

                    bvh.nodes.resize(first_child + 2);

                    auto first_bbox   = compute_bbox(item.begin, *split_pos);
                    auto second_bbox  = compute_bbox(*split_pos, item.end);
                    auto first_range  = std::make_pair(item.begin, *split_pos);
                    auto second_range = std::make_pair(*split_pos, item.end);

                    // For "any-hit" queries, the left child is chosen first, so we make sure that
                    // it is the child with the largest area, as it is more likely to contain an
                    // an occluder. See "SATO: Surface Area Traversal Order for Shadow Ray Tracing",
                    // by J. Nah and D. Manocha.
                    if (first_bbox.get_half_area() < second_bbox.get_half_area()) {
                        std::swap(first_bbox, second_bbox);
                        std::swap(first_range, second_range);
                    }

                    auto first_item  = WorkItem { first_child + 0, first_range.first, first_range.second };
                    auto second_item = WorkItem { first_child + 1, second_range.first, second_range.second };
                    bvh.nodes[first_child + 0].set_bbox(first_bbox);
                    bvh.nodes[first_child + 1].set_bbox(second_bbox);

                    // Process the largest child item first, in order to minimize the stack size.
                    if (first_item.size() < second_item.size())
                        std::swap(first_item, second_item);

                    stack.push(first_item);
                    stack.push(second_item);
                    continue;
                }
            }

            node.index = Node::Index::make_leaf(item.begin, item.size());
        }

        bvh.prim_ids = std::move(get_prim_ids());
        bvh.nodes.shrink_to_fit();
        return bvh;
    }